

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_simplify_tobit_conv(jit_State *J)

{
  TRef TVar1;
  ushort uVar2;
  
  uVar2 = (J->fold).left[0].field_0.op2 & 0x1f;
  if (uVar2 == 0x14) {
    (J->fold).ins.field_1.o = 'Y';
    (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
    (J->fold).ins.field_0.op2 = 0x274;
    TVar1 = 1;
  }
  else {
    TVar1 = 0;
    if (uVar2 == 0x13) {
      return (TRef)(J->fold).left[0].field_0.op1;
    }
  }
  return TVar1;
}

Assistant:

LJFOLD(TOBIT CONV KNUM)
LJFOLDF(simplify_tobit_conv)
{
  /* Fold even across PHI to avoid expensive num->int conversions in loop. */
  if ((fleft->op2 & IRCONV_SRCMASK) == IRT_INT) {
    lj_assertJ(irt_isnum(fleft->t), "expected TOBIT number arg");
    return fleft->op1;
  } else if ((fleft->op2 & IRCONV_SRCMASK) == IRT_U32) {
    lj_assertJ(irt_isnum(fleft->t), "expected TOBIT number arg");
    fins->o = IR_CONV;
    fins->op1 = fleft->op1;
    fins->op2 = (IRT_INT<<5)|IRT_U32;
    return RETRYFOLD;
  }
  return NEXTFOLD;
}